

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

int build_directory(char *path)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *dir;
  
  iVar2 = -1;
  if (*path != '\0') {
    iVar1 = mkdir(path,0x1ff);
    iVar2 = 0;
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      if (*piVar3 == 2) {
        dir = __ckd_salloc__(path,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                             ,0x285);
        path2dirname(path,dir);
        build_directory(dir);
        ckd_free(dir);
        iVar2 = mkdir(path,0x1ff);
        return iVar2;
      }
      iVar2 = 0;
      if (*piVar3 != 0x11) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                       ,0x281,"Failed to create %s",path);
        iVar2 = -1;
      }
    }
  }
  return iVar2;
}

Assistant:

int
build_directory(const char *path)
{
    int rv;

    /* Utterly failed... */
    if (strlen(path) == 0)
        return -1;

#if defined(_WIN32) && !defined(CYGWIN)
    else if ((rv = _mkdir(path)) == 0)
        return 0;
#elif defined(HAVE_SYS_STAT_H) /* Unix, Cygwin, doesn't work on MINGW */
    else if ((rv = mkdir(path, 0777)) == 0)
        return 0;
#endif

    /* Or, it already exists... */
    else if (errno == EEXIST)
        return 0;
    else if (errno != ENOENT) {
        E_ERROR_SYSTEM("Failed to create %s", path);
        return -1;
    }
    else {
        char *dirname = ckd_salloc(path);
        path2dirname(path, dirname);
        build_directory(dirname);
        ckd_free(dirname);

#if defined(_WIN32) && !defined(CYGWIN)
	return _mkdir(path);
#elif defined(HAVE_SYS_STAT_H) /* Unix, Cygwin, doesn't work on MINGW */
        return mkdir(path, 0777);
#endif
    }
    return -1; //control should never reach here; fixes some compiler warnings
}